

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall
CodeGenGenericContext::InvalidateDependand(CodeGenGenericContext *this,x86XmmReg dreg)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x200; lVar1 = lVar1 + 0x20) {
    if ((*(int *)((long)&this->xmmReg[0].type + lVar1) == 2) &&
       (*(x86XmmReg *)((long)&this->xmmReg[0].field_1 + lVar1) == dreg)) {
      *(undefined4 *)((long)&this->xmmReg[0].type + lVar1) = 5;
    }
  }
  for (lVar1 = 0; lVar1 != 0x480; lVar1 = lVar1 + 0x48) {
    if ((*(int *)((long)&this->memCache[0].value.type + lVar1) == 3) &&
       (*(x86XmmReg *)((long)&this->memCache[0].value.field_1 + lVar1) == dreg)) {
      *(undefined4 *)((long)&this->memCache[0].value.type + lVar1) = 0;
    }
  }
  return;
}

Assistant:

void CodeGenGenericContext::InvalidateDependand(x86XmmReg dreg)
{
	for(unsigned i = 0; i < rXmmRegCount; i++)
	{
		if(xmmReg[i].type == x86Argument::argReg && xmmReg[i].xmmArg == dreg)
			xmmReg[i].type = x86Argument::argPtrLabel;
	}

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.value.type == x86Argument::argXmmReg && entry.value.xmmArg == dreg)
		{
			entry.value.type = x86Argument::argNone;
			continue;
		}
	}
}